

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O1

bool __thiscall Omega_h::InputMap::is<int>(InputMap *this,string *name)

{
  Input *input;
  bool bVar1;
  iterator iVar2;
  long lVar3;
  InputScalar *this_00;
  Input *ptr_in;
  int ignored;
  int local_14;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
          ::find(&(this->map)._M_t,name);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->map)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = false;
  }
  else {
    input = *(Input **)(iVar2._M_node + 2);
    bVar1 = false;
    lVar3 = __dynamic_cast(input,&Input::typeinfo,&InputScalar::typeinfo,0);
    if (lVar3 != 0) {
      this_00 = as_type<Omega_h::InputScalar>(input);
      bVar1 = InputScalar::as(this_00,&local_14);
    }
  }
  return bVar1;
}

Assistant:

bool InputMap::is(std::string const& name) {
  auto const it = map.find(name);
  if (it == map.end()) return false;
  auto const& sptr = it->second;
  ScalarType ignored;
  return is_type<InputScalar>(*sptr) && as_type<InputScalar>(*sptr).as(ignored);
}